

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcNamedUnit::IfcNamedUnit(IfcNamedUnit *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>)._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[2];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>)._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[3];
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).field_0x10
       = 0;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).field_0x18
       = &this->field_0x28;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>).field_0x20
       = 0;
  this->field_0x28 = 0;
  return;
}

Assistant:

Object(const char* classname = "unknown")
        : id( 0 )
        , classname(classname) {
            // empty
        }